

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O2

int Abc_NtkAigToBdd(Abc_Ntk_t *pNtk)

{
  Hop_Man_t *p;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar1;
  uint uVar2;
  int iVar3;
  int Entry;
  DdManager *ddDestination;
  DdManager *unique;
  Vec_Int_t *p_00;
  DdNode *pDVar4;
  Hop_Obj_t *pHVar5;
  Abc_Obj_t *pObj;
  DdNode *n;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  Vec_Int_t *local_38;
  
  if (pNtk->ntkFunc != ABC_FUNC_AIG) {
    __assert_fail("Abc_NtkHasAig(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                  ,0x28a,"int Abc_NtkAigToBdd(Abc_Ntk_t *)");
  }
  uVar2 = Abc_NtkGetFaninMax(pNtk);
  if (uVar2 == 0) {
    puts("Warning: The network has only constant nodes.");
  }
  uVar8 = 0;
  ddDestination = Cudd_Init(uVar2,0,0x100,0x40000,0);
  unique = Cudd_Init(uVar2,0,0x100,0x40000,0);
  Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
  p_00 = Vec_IntAlloc(uVar2);
  p = (Hop_Man_t *)pNtk->pManFunc;
  local_38 = p_00;
  if ((int)uVar2 <= p->nObjs[2]) {
    uVar6 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar6 = uVar8;
    }
    while (iVar7 = (int)uVar8, (int)uVar6 != iVar7) {
      pDVar4 = Cudd_bddIthVar(unique,iVar7);
      pHVar5 = Hop_ManPi(p,iVar7);
      (pHVar5->field_0).pData = pDVar4;
      uVar8 = (ulong)(iVar7 + 1);
    }
    iVar7 = 0;
    do {
      if (pNtk->vObjs->nSize <= iVar7) {
        Extra_StopManager(unique);
        Vec_IntFreeP(&local_38);
        Hop_ManStop((Hop_Man_t *)pNtk->pManFunc);
        pNtk->pManFunc = ddDestination;
        pNtk->ntkFunc = ABC_FUNC_BDD;
        return 1;
      }
      pObj = Abc_NtkObj(pNtk,iVar7);
      if (((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) &&
         (iVar3 = Abc_ObjIsBarBuf(pObj), iVar3 == 0)) {
        aVar1 = pObj->field_5;
        pHVar5 = (Hop_Obj_t *)((ulong)aVar1.pData & 0xfffffffffffffffe);
        iVar3 = Hop_ObjIsConst1(pHVar5);
        uVar2 = aVar1.iData;
        if (iVar3 == 0) {
          Abc_ConvertAigToBdd_rec1(unique,pHVar5);
          pDVar4 = (DdNode *)((ulong)(uVar2 & 1) ^ (ulong)(pHVar5->field_0).pData);
          Cudd_Ref(pDVar4);
          Abc_ConvertAigToBdd_rec2(unique,pHVar5);
          Cudd_Deref(pDVar4);
        }
        else {
          pDVar4 = Cudd_ReadOne(unique);
          pDVar4 = (DdNode *)((ulong)(uVar2 & 1) ^ (ulong)pDVar4);
        }
        if (pDVar4 == (DdNode *)0x0) {
          puts("Abc_NtkAigToBdd: Error while converting AIG into BDD.");
          return 0;
        }
        Cudd_Ref(pDVar4);
        Vec_IntFill(p_00,(pObj->vFanins).nSize,-1);
        iVar3 = 0;
        for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
          if (unique->invperm[uVar8] < (pObj->vFanins).nSize) {
            Vec_IntWriteEntry(p_00,unique->invperm[uVar8],iVar3);
            iVar3 = iVar3 + 1;
          }
        }
        if (iVar3 != (pObj->vFanins).nSize) {
          __assert_fail("iVar == Abc_ObjFaninNum(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                        ,0x2af,"int Abc_NtkAigToBdd(Abc_Ntk_t *)");
        }
        n = Extra_TransferPermute(unique,ddDestination,pDVar4,p_00->pArray);
        (pObj->field_5).pData = n;
        Cudd_Ref(n);
        Cudd_RecursiveDeref(unique,pDVar4);
        p_00->nSize = 0;
        for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
          if (unique->invperm[uVar8] < (pObj->vFanins).nSize) {
            iVar3 = Vec_IntEntry(&pObj->vFanins,unique->invperm[uVar8]);
            Vec_IntPush(p_00,iVar3);
          }
        }
        for (iVar3 = 0; iVar3 < (pObj->vFanins).nSize; iVar3 = iVar3 + 1) {
          Entry = Vec_IntEntry(p_00,iVar3);
          Vec_IntWriteEntry(&pObj->vFanins,iVar3,Entry);
        }
      }
      iVar7 = iVar7 + 1;
    } while( true );
  }
  __assert_fail("Hop_ManPiNum(pMan) >= nFaninsMax",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                ,0x29a,"int Abc_NtkAigToBdd(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkAigToBdd( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    Hop_Man_t * pMan;
    DdNode * pFunc;
    DdManager * dd, * ddTemp = NULL;
    Vec_Int_t * vFanins = NULL;
    int nFaninsMax, i, k, iVar;

    assert( Abc_NtkHasAig(pNtk) ); 

    // start the functionality manager
    nFaninsMax = Abc_NtkGetFaninMax( pNtk );
    if ( nFaninsMax == 0 )
        printf( "Warning: The network has only constant nodes.\n" );

    dd = Cudd_Init( nFaninsMax, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );

    // start temporary manager for reordered local functions
    ddTemp = Cudd_Init( nFaninsMax, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( ddTemp,  CUDD_REORDER_SYMM_SIFT );
    vFanins = Vec_IntAlloc( nFaninsMax );

    // set the mapping of elementary AIG nodes into the elementary BDD nodes
    pMan = (Hop_Man_t *)pNtk->pManFunc;
    assert( Hop_ManPiNum(pMan) >= nFaninsMax ); 
    for ( i = 0; i < nFaninsMax; i++ )
        Hop_ManPi(pMan, i)->pData = Cudd_bddIthVar(ddTemp, i);

    // convert each node from SOP to BDD
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjIsBarBuf(pNode) )
            continue;
        pFunc = Abc_ConvertAigToBdd( ddTemp, (Hop_Obj_t *)pNode->pData );
        if ( pFunc == NULL )
        {
            printf( "Abc_NtkAigToBdd: Error while converting AIG into BDD.\n" );
            return 0;
        }
        Cudd_Ref( pFunc );
        // find variable mapping
        Vec_IntFill( vFanins, Abc_ObjFaninNum(pNode), -1 );
        for ( k = iVar = 0; k < nFaninsMax; k++ )
            if ( ddTemp->invperm[k] < Abc_ObjFaninNum(pNode) )
                Vec_IntWriteEntry( vFanins, ddTemp->invperm[k], iVar++ );
        assert( iVar == Abc_ObjFaninNum(pNode) );
        // transfer to the main manager
        pNode->pData = Extra_TransferPermute( ddTemp, dd, pFunc, Vec_IntArray(vFanins) );
        Cudd_Ref( (DdNode *)pNode->pData );
        Cudd_RecursiveDeref( ddTemp, pFunc );
        // update variable order
        Vec_IntClear( vFanins );
        for ( k = 0; k < nFaninsMax; k++ )
            if ( ddTemp->invperm[k] < Abc_ObjFaninNum(pNode) )
                Vec_IntPush( vFanins, Vec_IntEntry(&pNode->vFanins, ddTemp->invperm[k]) );
        for ( k = 0; k < Abc_ObjFaninNum(pNode); k++ )
            Vec_IntWriteEntry( &pNode->vFanins, k, Vec_IntEntry(vFanins, k) );
    }

//    printf( "Reorderings performed = %d.\n", Cudd_ReadReorderings(ddTemp) );
    Extra_StopManager( ddTemp );
    Vec_IntFreeP( &vFanins );
    Hop_ManStop( (Hop_Man_t *)pNtk->pManFunc );
    pNtk->pManFunc = dd;

    // update the network type
    pNtk->ntkFunc = ABC_FUNC_BDD;
    return 1;
}